

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

int32_t uloc_getCountry_63(char *localeID,char *country,int32_t countryCapacity,UErrorCode *err)

{
  UBool UVar1;
  char *local_40;
  char *scriptID;
  UErrorCode *pUStack_30;
  int32_t i;
  UErrorCode *err_local;
  char *pcStack_20;
  int32_t countryCapacity_local;
  char *country_local;
  char *localeID_local;
  
  scriptID._4_4_ = 0;
  if ((err == (UErrorCode *)0x0) ||
     (pUStack_30 = err, err_local._4_4_ = countryCapacity, pcStack_20 = country,
     country_local = localeID, UVar1 = U_FAILURE(*err), UVar1 != '\0')) {
    localeID_local._4_4_ = 0;
  }
  else {
    if (country_local == (char *)0x0) {
      country_local = uloc_getDefault_63();
    }
    ulocimp_getLanguage_63(country_local,(char *)0x0,0,&country_local);
    if ((*country_local == '_') || (*country_local == '-')) {
      ulocimp_getScript_63(country_local + 1,(char *)0x0,0,&local_40);
      if (local_40 != country_local + 1) {
        country_local = local_40;
      }
      if ((*country_local == '_') || (*country_local == '-')) {
        scriptID._4_4_ =
             ulocimp_getCountry_63(country_local + 1,pcStack_20,err_local._4_4_,(char **)0x0);
      }
    }
    localeID_local._4_4_ = u_terminateChars_63(pcStack_20,err_local._4_4_,scriptID._4_4_,pUStack_30)
    ;
  }
  return localeID_local._4_4_;
}

Assistant:

U_CAPI int32_t  U_EXPORT2
uloc_getCountry(const char* localeID,
            char* country,
            int32_t countryCapacity,
            UErrorCode* err)
{
    int32_t i=0;

    if(err==NULL || U_FAILURE(*err)) {
        return 0;
    }

    if(localeID==NULL) {
        localeID=uloc_getDefault();
    }

    /* Skip the language */
    ulocimp_getLanguage(localeID, NULL, 0, &localeID);
    if(_isIDSeparator(*localeID)) {
        const char *scriptID;
        /* Skip the script if available */
        ulocimp_getScript(localeID+1, NULL, 0, &scriptID);
        if(scriptID != localeID+1) {
            /* Found optional script */
            localeID = scriptID;
        }
        if(_isIDSeparator(*localeID)) {
            i=ulocimp_getCountry(localeID+1, country, countryCapacity, NULL);
        }
    }
    return u_terminateChars(country, countryCapacity, i, err);
}